

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall
Graph<Node>::printShortestPath(Graph<Node> *this,ofstream *fout,int *node1,int *node2)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  poVar1 = std::operator<<((ostream *)fout,"Shortest path between ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*node1);
  poVar1 = std::operator<<(poVar1," and ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*node2);
  std::operator<<(poVar1,":\n\n");
  uVar4 = (ulong)*node1;
  lVar2 = (long)*node2;
  if ((this->minDist).vect[uVar4].vect[lVar2] == -1) {
    std::operator<<((ostream *)fout,"DOES NOT EXIST");
  }
  else {
    while( true ) {
      iVar3 = (int)uVar4;
      if (iVar3 == (int)lVar2) break;
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)fout,iVar3);
      std::operator<<(poVar1,' ');
      lVar2 = (long)*node2;
      uVar4 = (ulong)(uint)(this->nextNodeInPath).vect[iVar3].vect[lVar2];
    }
    fout = (ofstream *)std::ostream::operator<<((ostream *)fout,(int)lVar2);
  }
  std::operator<<((ostream *)fout,"\n------------------------\n\n");
  return;
}

Assistant:

void printShortestPath(std::ofstream &fout, const int &node1, const int &node2) {
        fout << "Shortest path between " << node1 << " and " << node2 << ":\n\n";
        if (minDist[node1][node2] == -1) {
            fout << "DOES NOT EXIST";
            fout << "\n------------------------\n\n";
            return;
        }

        int currNode = node1;
        while (currNode != node2) {
            fout << currNode << ' ';
            currNode = nextNodeInPath[currNode][node2];
        }

        fout << node2 << "\n------------------------\n\n";
    }